

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtexture.cpp
# Opt level: O0

void __thiscall FJPEGTexture::FJPEGTexture(FJPEGTexture *this,int lumpnum,int width,int height)

{
  WORD local_1c;
  WORD local_18;
  int height_local;
  int width_local;
  int lumpnum_local;
  FJPEGTexture *this_local;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,lumpnum);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FJPEGTexture_00b87d20;
  this->Pixels = (BYTE *)0x0;
  (this->super_FTexture).UseType = '\b';
  (this->super_FTexture).LeftOffset = 0;
  (this->super_FTexture).TopOffset = 0;
  (this->super_FTexture).field_0x31 = (this->super_FTexture).field_0x31 & 0xf7;
  local_18 = (WORD)width;
  (this->super_FTexture).Width = local_18;
  local_1c = (WORD)height;
  (this->super_FTexture).Height = local_1c;
  FTexture::CalcBitSize(&this->super_FTexture);
  this->DummySpans[0].TopOffset = 0;
  this->DummySpans[0].Length = (this->super_FTexture).Height;
  this->DummySpans[1].TopOffset = 0;
  this->DummySpans[1].Length = 0;
  return;
}

Assistant:

FJPEGTexture::FJPEGTexture (int lumpnum, int width, int height)
: FTexture(NULL, lumpnum), Pixels(0)
{
	UseType = TEX_MiscPatch;
	LeftOffset = 0;
	TopOffset = 0;
	bMasked = false;

	Width = width;
	Height = height;
	CalcBitSize ();

	DummySpans[0].TopOffset = 0;
	DummySpans[0].Length = Height;
	DummySpans[1].TopOffset = 0;
	DummySpans[1].Length = 0;
}